

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_manager.cpp
# Opt level: O1

FatalException *
duckdb::ErrorManager::InvalidatedDatabase
          (FatalException *__return_storage_ptr__,ClientContext *context,string *invalidated_msg)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  string local_40;
  
  pcVar1 = (invalidated_msg->_M_dataplus)._M_p;
  local_60[0] = local_50;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_60,pcVar1,pcVar1 + invalidated_msg->_M_string_length);
  FormatException<std::__cxx11::string>
            (&local_40,(ErrorManager *)context,(ClientContext *)0x2,(ErrorType)(string *)local_60,
             in_R8);
  FatalException::FatalException(__return_storage_ptr__,FATAL,(string *)&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

FatalException ErrorManager::InvalidatedDatabase(ClientContext &context, const string &invalidated_msg) {
	return FatalException(ErrorManager::FormatException(context, ErrorType::INVALIDATED_DATABASE, invalidated_msg));
}